

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool parse_number(cJSON *item,parse_buffer *input_buffer)

{
  long lVar1;
  uchar *puVar2;
  byte bVar3;
  cJSON_bool cVar4;
  int iVar5;
  long lVar6;
  byte bVar7;
  uint uVar8;
  long in_FS_OFFSET;
  double dVar9;
  uchar *after_end;
  uchar number_c_string [64];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  after_end = (uchar *)0x0;
  bVar3 = get_decimal_point();
  cVar4 = 0;
  if ((input_buffer != (parse_buffer *)0x0) &&
     (puVar2 = input_buffer->content, puVar2 != (uchar *)0x0)) {
    for (lVar6 = 0; (lVar6 != 0x3f && (lVar6 + input_buffer->offset < input_buffer->length));
        lVar6 = lVar6 + 1) {
      bVar7 = puVar2[lVar6 + input_buffer->offset];
      uVar8 = bVar7 - 0x2b;
      if ((0x3a < uVar8) ||
         (((0x400000004007fe5U >> ((ulong)uVar8 & 0x3f) & 1) == 0 &&
          (bVar7 = bVar3, (ulong)uVar8 != 3)))) break;
      number_c_string[lVar6] = bVar7;
    }
    number_c_string[lVar6] = '\0';
    dVar9 = strtod((char *)number_c_string,(char **)&after_end);
    if (number_c_string == after_end) {
      cVar4 = 0;
    }
    else {
      item->valuedouble = dVar9;
      iVar5 = 0x7fffffff;
      if ((dVar9 < 2147483647.0) && (iVar5 = -0x80000000, -2147483648.0 < dVar9)) {
        iVar5 = (int)dVar9;
      }
      item->valueint = iVar5;
      item->type = 8;
      input_buffer->offset = (size_t)(after_end + (input_buffer->offset - (long)number_c_string));
      cVar4 = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return cVar4;
}

Assistant:

static cJSON_bool parse_number(cJSON * const item, parse_buffer * const input_buffer)
{
    double number = 0;
    unsigned char *after_end = NULL;
    unsigned char number_c_string[64];
    unsigned char decimal_point = get_decimal_point();
    size_t i = 0;

    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false;
    }

    /* copy the number into a temporary buffer and replace '.' with the decimal point
     * of the current locale (for strtod)
     * This also takes care of '\0' not necessarily being available for marking the end of the input */
    for (i = 0; (i < (sizeof(number_c_string) - 1)) && can_access_at_index(input_buffer, i); i++)
    {
        switch (buffer_at_offset(input_buffer)[i])
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            case '+':
            case '-':
            case 'e':
            case 'E':
                number_c_string[i] = buffer_at_offset(input_buffer)[i];
                break;

            case '.':
                number_c_string[i] = decimal_point;
                break;

            default:
                goto loop_end;
        }
    }
loop_end:
    number_c_string[i] = '\0';

    number = strtod((const char*)number_c_string, (char**)&after_end);
    if (number_c_string == after_end)
    {
        return false; /* parse_error */
    }

    item->valuedouble = number;

    /* use saturation in case of overflow */
    if (number >= INT_MAX)
    {
        item->valueint = INT_MAX;
    }
    else if (number <= (double)INT_MIN)
    {
        item->valueint = INT_MIN;
    }
    else
    {
        item->valueint = (int)number;
    }

    item->type = cJSON_Number;

    input_buffer->offset += (size_t)(after_end - number_c_string);
    return true;
}